

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O2

AInventory * __thiscall ASigil::CreateCopy(ASigil *this,AActor *other)

{
  int iVar1;
  ASigil *pAVar2;
  
  pAVar2 = Spawn<ASigil>();
  iVar1 = (this->super_AWeapon).super_AInventory.MaxAmount;
  (pAVar2->super_AWeapon).super_AInventory.Amount = (this->super_AWeapon).super_AInventory.Amount;
  (pAVar2->super_AWeapon).super_AInventory.MaxAmount = iVar1;
  *(undefined4 *)&(pAVar2->super_AWeapon).field_0x584 =
       *(undefined4 *)&(this->super_AWeapon).field_0x584;
  (pAVar2->super_AWeapon).super_AInventory.Icon.texnum =
       (this->super_AWeapon).super_AInventory.Icon.texnum;
  (*(this->super_AWeapon).super_AInventory.super_AActor.super_DThinker.super_DObject._vptr_DObject
    [0x36])(this);
  return (AInventory *)pAVar2;
}

Assistant:

AInventory *ASigil::CreateCopy (AActor *other)
{
	ASigil *copy = Spawn<ASigil> ();
	copy->Amount = Amount;
	copy->MaxAmount = MaxAmount;
	copy->NumPieces = NumPieces;
	copy->Icon = Icon;
	GoAwayAndDie ();
	return copy;
}